

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectFlatLoop<int,int,duckdb::GreaterThanEquals,true,false,true,true>
                (int *ldata,int *rdata,SelectionVector *sel,idx_t count,ValidityMask *validity_mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  int iVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  idx_t iVar8;
  sel_t sVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  
  if (count + 0x3f < 0x40) {
    iVar8 = 0;
  }
  else {
    puVar3 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar8 = 0;
    lVar11 = 0;
    uVar14 = 0;
    uVar15 = 0;
    do {
      uVar13 = uVar14;
      if (puVar3 == (unsigned_long *)0x0) {
        uVar16 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar16 = count;
        }
LAB_00f107ce:
        if (uVar14 < uVar16) {
          psVar5 = sel->sel_vector;
          iVar1 = *ldata;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          do {
            uVar13 = uVar14;
            if (psVar5 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar5[uVar14];
            }
            iVar2 = rdata[uVar14];
            psVar6[iVar8] = (sel_t)uVar13;
            iVar8 = iVar8 + (iVar2 <= iVar1);
            psVar7[lVar11] = (sel_t)uVar13;
            lVar11 = lVar11 + (ulong)(iVar1 < iVar2);
            uVar14 = uVar14 + 1;
            uVar13 = uVar16;
          } while (uVar16 != uVar14);
        }
      }
      else {
        uVar4 = puVar3[uVar15];
        uVar16 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar16 = count;
        }
        if (uVar4 == 0xffffffffffffffff) goto LAB_00f107ce;
        if (uVar4 == 0) {
          uVar13 = uVar16;
          if (uVar14 < uVar16) {
            psVar5 = sel->sel_vector;
            psVar6 = false_sel->sel_vector;
            do {
              uVar13 = uVar14;
              if (psVar5 != (sel_t *)0x0) {
                uVar13 = (ulong)psVar5[uVar14];
              }
              psVar6[lVar11] = (sel_t)uVar13;
              lVar11 = lVar11 + 1;
              uVar14 = uVar14 + 1;
              uVar13 = uVar16;
            } while (uVar16 != uVar14);
          }
        }
        else if (uVar14 < uVar16) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          uVar10 = 0;
          do {
            if (psVar5 == (sel_t *)0x0) {
              sVar9 = (int)uVar14 + (int)uVar10;
            }
            else {
              sVar9 = psVar5[uVar14 + uVar10];
            }
            if ((uVar4 >> (uVar10 & 0x3f) & 1) == 0) {
              bVar12 = false;
            }
            else {
              bVar12 = rdata[uVar14 + uVar10] <= *ldata;
            }
            psVar6[iVar8] = sVar9;
            iVar8 = iVar8 + bVar12;
            psVar7[lVar11] = sVar9;
            lVar11 = lVar11 + (ulong)(bVar12 ^ 1);
            uVar10 = uVar10 + 1;
            uVar13 = uVar16;
          } while (uVar16 - uVar14 != uVar10);
        }
      }
      uVar14 = uVar13;
      uVar15 = uVar15 + 1;
    } while (uVar15 != count + 0x3f >> 6);
  }
  return iVar8;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}